

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HFactor.cpp
# Opt level: O2

void __thiscall
HFactor::ftranL(HFactor *this,HVector *rhs,double expected_density,
               HighsTimerClock *factor_timer_clock_pointer)

{
  double dVar1;
  int iVar2;
  int iVar3;
  HighsInt *h_start;
  pointer piVar4;
  pointer pdVar5;
  pointer piVar6;
  pointer piVar7;
  pointer piVar8;
  pointer pdVar9;
  HighsInt factor_clock;
  HighsInt i;
  long lVar10;
  int iVar11;
  HighsInt k;
  long lVar12;
  FactorTimer factor_timer;
  
  FactorTimer::start(&factor_timer,6,factor_timer_clock_pointer);
  if (this->update_method == 4) {
    FactorTimer::start(&factor_timer,7,factor_timer_clock_pointer);
    HVectorBase<double>::tight(rhs);
    HVectorBase<double>::pack(rhs);
    ftranAPF(this,rhs);
    FactorTimer::stop(&factor_timer,7,factor_timer_clock_pointer);
    HVectorBase<double>::tight(rhs);
  }
  if (((0.15 < expected_density) || (rhs->count < 0)) ||
     (0.05 < (double)rhs->count * this->inv_num_row)) {
    factor_clock = 9;
    FactorTimer::start(&factor_timer,9,factor_timer_clock_pointer);
    piVar4 = (rhs->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5 = (rhs->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar6 = (this->l_pivot_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar7 = (this->l_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar8 = (this->l_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar9 = (this->l_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar11 = 0;
    for (lVar10 = 0; lVar10 < this->num_row; lVar10 = lVar10 + 1) {
      iVar2 = piVar6[lVar10];
      dVar1 = pdVar5[iVar2];
      if (ABS(dVar1) <= 1e-14) {
        pdVar5[iVar2] = 0.0;
      }
      else {
        piVar4[iVar11] = iVar2;
        iVar2 = piVar7[lVar10 + 1];
        for (lVar12 = (long)piVar7[lVar10]; lVar12 < iVar2; lVar12 = lVar12 + 1) {
          iVar3 = piVar8[lVar12];
          pdVar5[iVar3] = pdVar9[lVar12] * -dVar1 + pdVar5[iVar3];
        }
        iVar11 = iVar11 + 1;
      }
    }
    rhs->count = iVar11;
  }
  else {
    factor_clock = 10;
    FactorTimer::start(&factor_timer,10,factor_timer_clock_pointer);
    h_start = (this->l_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    solveHyper(this->num_row,
               (this->l_pivot_lookup).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
               (this->l_pivot_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,(double *)0x0,h_start,h_start + 1,
               (this->l_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
               (this->l_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start,rhs);
  }
  FactorTimer::stop(&factor_timer,factor_clock,factor_timer_clock_pointer);
  FactorTimer::stop(&factor_timer,6,factor_timer_clock_pointer);
  return;
}

Assistant:

void HFactor::ftranL(HVector& rhs, const double expected_density,
                     HighsTimerClock* factor_timer_clock_pointer) const {
  FactorTimer factor_timer;
  factor_timer.start(FactorFtranLower, factor_timer_clock_pointer);
  if (update_method == kUpdateMethodApf) {
    assert(!(update_method == kUpdateMethodApf));
    factor_timer.start(FactorFtranLowerAPF, factor_timer_clock_pointer);
    rhs.tight();
    rhs.pack();
    ftranAPF(rhs);
    factor_timer.stop(FactorFtranLowerAPF, factor_timer_clock_pointer);
    rhs.tight();
  }

  // Determine style of solve
  double current_density = 1.0 * rhs.count * inv_num_row;
  const bool sparse_solve = rhs.count < 0 || current_density > kHyperCancel ||
                            expected_density > kHyperFtranL;
  if (sparse_solve) {
    factor_timer.start(FactorFtranLowerSps, factor_timer_clock_pointer);
    // Alias to RHS
    HighsInt* rhs_index = rhs.index.data();
    double* rhs_array = rhs.array.data();
    // Alias to factor L
    const HighsInt* l_start = this->l_start.data();
    const HighsInt* l_index = this->l_index.data();
    const double* l_value = this->l_value.data();
    // Local accumulation of RHS count
    HighsInt rhs_count = 0;
    // Transform
    for (HighsInt i = 0; i < num_row; i++) {
      HighsInt pivotRow = l_pivot_index[i];
      const double pivot_multiplier = rhs_array[pivotRow];
      if (fabs(pivot_multiplier) > kHighsTiny) {
        rhs_index[rhs_count++] = pivotRow;
        const HighsInt start = l_start[i];
        const HighsInt end = l_start[i + 1];
        for (HighsInt k = start; k < end; k++)
          rhs_array[l_index[k]] -= pivot_multiplier * l_value[k];
      } else
        rhs_array[pivotRow] = 0;
    }
    // Save the count
    rhs.count = rhs_count;
    factor_timer.stop(FactorFtranLowerSps, factor_timer_clock_pointer);
  } else {
    // Hyper-sparse solve
    factor_timer.start(FactorFtranLowerHyper, factor_timer_clock_pointer);
    const HighsInt* l_index = this->l_index.data();
    const double* l_value = this->l_value.data();
    solveHyper(num_row, l_pivot_lookup.data(), l_pivot_index.data(), 0,
               l_start.data(), &l_start[1], &l_index[0], &l_value[0], &rhs);
    factor_timer.stop(FactorFtranLowerHyper, factor_timer_clock_pointer);
  }
  factor_timer.stop(FactorFtranLower, factor_timer_clock_pointer);
}